

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O1

void __thiscall
QueryTests_CreateContainer_canDetermineSpecificationForCreateContainer_Test::
~QueryTests_CreateContainer_canDetermineSpecificationForCreateContainer_Test
          (QueryTests_CreateContainer_canDetermineSpecificationForCreateContainer_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(QueryTests_CreateContainer,canDetermineSpecificationForCreateContainer)
{
  database::Query query_create_container = "create container company.employee(employee_id integer,employee_name string,employee_status string)";
  ASSERT_TRUE(query_create_container.transactionMetaType() == database::ddl);
  ASSERT_TRUE(query_create_container.databaseName() == "company");
  ASSERT_TRUE(query_create_container.containerName() == "employee");
  database::api_schema_type expected_schema = {
    {"employee_id",database::integer},
    {"employee_name",database::string},
    {"employee_status",database::string}
  };
  ASSERT_TRUE(query_create_container.schema() == expected_schema);
}